

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  pointer pOVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  ParseArgumentStatus PVar8;
  ostream *poVar9;
  size_t sVar10;
  reference key;
  ctrl_t *extraout_RAX;
  ctrl_t *pcVar11;
  size_type sVar12;
  pointer pbVar13;
  pointer pbVar14;
  long lVar15;
  ParseArgumentStatus PVar16;
  ulong uVar17;
  char *pcVar18;
  CommandLineInterface *this_00;
  char *in_R9;
  OutputDirective *d;
  pointer pOVar19;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_01;
  bool bVar20;
  string_view directive;
  string_view plugin_prefix;
  string_view str;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string value;
  iterator __begin2;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint local_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_a8 [48];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_78;
  iterator local_70;
  string local_60;
  iterator local_40;
  
  pcVar18 = *argv;
  pcVar2 = (char *)(this->executable_name_)._M_string_length;
  strlen(pcVar18);
  this_00 = this;
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar18);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
LAB_0018b8eb:
    PVar16 = PARSE_ARGUMENT_DONE_AND_EXIT;
    PrintHelpText(this);
    goto LAB_0018bf9c;
  }
  uVar17 = 1;
  do {
    pcVar18 = argv[uVar17];
    if (*pcVar18 == '@') {
      bVar6 = ExpandArgumentFile(this_00,pcVar18 + 1,&local_c8);
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open argument file: ",0x1e);
        pcVar18 = argv[uVar17];
        sVar10 = strlen(pcVar18 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18 + 1,sVar10)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        PVar16 = PARSE_ARGUMENT_FAIL;
        std::ostream::flush();
        goto LAB_0018bf9c;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,pcVar18,(allocator<char> *)local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      this_00 = (CommandLineInterface *)local_110._0_8_;
      if ((CommandLineInterface *)local_110._0_8_ != (CommandLineInterface *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
      }
    }
    uVar17 = uVar17 + 1;
  } while ((uint)argc != uVar17);
  if (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018b8eb;
  PVar16 = PARSE_ARGUMENT_FAIL;
  uVar17 = 0;
  do {
    local_110._8_8_ = 0;
    local_110._0_8_ = local_110 + 0x10;
    local_110[0x10] = '\0';
    local_a8._0_8_ = local_a8 + 0x10;
    local_a8._8_8_ = (slot_type *)0x0;
    local_a8[0x10] = '\0';
    bVar6 = ParseArgument(this_00,local_c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p
                          ,(string *)local_110,(string *)local_a8);
    if (bVar6) {
      uVar1 = uVar17 + 1;
      if ((uVar1 != (long)local_c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) &&
         (*local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_dataplus._M_p != '-')) {
        std::__cxx11::string::_M_assign((string *)local_a8);
        uVar17 = uVar1;
        goto LAB_0018b855;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_110._0_8_,local_110._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      iVar7 = std::__cxx11::string::compare((char *)local_110);
      if (iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      bVar6 = false;
      PVar16 = PARSE_ARGUMENT_FAIL;
    }
    else {
LAB_0018b855:
      PVar8 = InterpretArgument(this,(string *)local_110,(string *)local_a8);
      bVar6 = PVar8 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if (!bVar6) {
        PVar16 = PVar8;
      }
    }
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    }
    this_00 = (CommandLineInterface *)local_110._0_8_;
    if ((CommandLineInterface *)local_110._0_8_ != (CommandLineInterface *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
    }
    if (!bVar6) goto LAB_0018bf9c;
    uVar17 = uVar17 + 1;
  } while (uVar17 < (ulong)((long)local_c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_c8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
  local_70 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&this->plugin_parameters_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&this->plugin_parameters_);
  local_40.ctrl_ = (ctrl_t *)0x0;
  this_01 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)&this->plugins_;
  local_cc = 0;
  local_78 = this_01;
  while( true ) {
    bVar6 = absl::lts_20250127::container_internal::operator==(&local_70,&local_40);
    if (bVar6) break;
    key = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::iterator::operator*(&local_70);
    local_110._0_16_ =
         (undefined1  [16])
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::find<std::__cxx11::string>(this_01,&key->first);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_01);
    local_a8._0_8_ = (pointer)0x0;
    bVar6 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)local_110,(iterator *)local_a8);
    if (bVar6) {
      pOVar19 = (this->output_directives_).
                super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (this->output_directives_).
               super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pOVar19 != pOVar3) {
        bVar6 = false;
        do {
          if (pOVar19->generator == (CodeGenerator *)0x0) {
            directive._M_str = in_R9;
            directive._M_len = (size_t)(pOVar19->name)._M_dataplus._M_p;
            plugin_prefix._M_str = (char *)(pOVar19->name)._M_string_length;
            plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
            compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                      ((string *)local_110,
                       (_anonymous_namespace_ *)(this->plugin_prefix_)._M_string_length,
                       plugin_prefix,directive);
            uVar4 = local_110._0_8_;
            if ((slot_type *)local_110._8_8_ == (slot_type *)(key->first)._M_string_length) {
              if ((slot_type *)local_110._8_8_ == (slot_type *)0x0) {
                bVar6 = true;
                bVar20 = true;
              }
              else {
                iVar7 = bcmp((void *)local_110._0_8_,(key->first)._M_dataplus._M_p,local_110._8_8_);
                bVar20 = iVar7 == 0;
                bVar6 = (bool)(bVar6 | bVar20);
              }
            }
            else {
              bVar20 = false;
            }
            if ((undefined1 *)uVar4 != local_110 + 0x10) {
              operator_delete((void *)uVar4,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
            }
            if (bVar20) break;
          }
          pOVar19 = pOVar19 + 1;
        } while (pOVar19 != pOVar3);
        this_01 = local_78;
        if (bVar6) goto LAB_0018bc6c;
      }
      local_110._0_8_ = (this->plugin_prefix_)._M_string_length;
      local_110._8_8_ = (this->plugin_prefix_)._M_dataplus._M_p;
      local_a8._0_8_ = (pointer)0x7;
      local_a8._8_8_ = "gen-cpp";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_60,(lts_20250127 *)local_110,(AlphaNum *)local_a8,
                 (AlphaNum *)local_110._0_8_);
      _Var5._M_p = local_60._M_dataplus._M_p;
      this_01 = local_78;
      sVar10 = (key->first)._M_string_length;
      if (sVar10 == local_60._M_string_length) {
        if (sVar10 == 0) {
          bVar6 = false;
        }
        else {
          iVar7 = bcmp((key->first)._M_dataplus._M_p,local_60._M_dataplus._M_p,sVar10);
          bVar6 = iVar7 != 0;
        }
      }
      else {
        bVar6 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &local_60.field_2) {
        operator_delete(_Var5._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown flag: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"--",2);
        std::__cxx11::string::substr((ulong)local_110,(ulong)key);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_110._0_8_,local_110._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_opt",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar11 = local_110 + 0x10;
        if ((ctrl_t *)local_110._0_8_ != pcVar11) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
          pcVar11 = extraout_RAX;
        }
        local_cc = (uint)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
      }
    }
LAB_0018bc6c:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&local_70);
  }
  PVar16 = PARSE_ARGUMENT_FAIL;
  if ((local_cc & 1) != 0) goto LAB_0018bf9c;
  if (((this->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->proto_path_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->descriptor_set_in_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_110,(char (*) [1])0x4f289c,(char (*) [2])0x6790d8);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
    }
  }
  switch(this->mode_) {
  case MODE_COMPILE:
    pbVar13 = (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 == pbVar14) {
LAB_0018beb6:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing input file.",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      goto LAB_0018bf9c;
    }
    if ((((this->output_directives_).
          super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->output_directives_).
          super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((this->descriptor_set_out_name_)._M_string_length == 0)) &&
       ((this->edition_defaults_out_name_)._M_string_length == 0)) {
      lVar15 = 0x1a;
      pcVar18 = "Missing output directives.";
    }
    else {
LAB_0018bf42:
      if (this->deterministic_output_ == false) {
        if (((this->dependency_out_name_)._M_string_length == 0) ||
           ((ulong)((long)pbVar14 - (long)pbVar13) < 0x21)) goto LAB_0018bdf2;
        lVar15 = 0x41;
        pcVar18 = "Can only process one input file when using --dependency_out=FILE.";
      }
      else {
        lVar15 = 0x32;
        pcVar18 = "Can only use --deterministic_output with --encode.";
      }
    }
    goto LAB_0018bf84;
  case MODE_ENCODE:
  case MODE_PRINT:
switchD_0018bd33_caseD_1:
    pbVar13 = (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar14 = (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((pbVar13 == pbVar14) &&
       ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0018beb6;
    if ((this->dependency_out_name_)._M_string_length == 0) {
      if (this->mode_ != MODE_ENCODE) goto LAB_0018bf42;
LAB_0018bdf2:
      sVar12 = (this->descriptor_set_out_name_)._M_string_length;
      if ((sVar12 == 0 & this->imports_in_descriptor_set_) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "--include_imports only makes sense when combined with --descriptor_set_out.",
                   0x4b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        sVar12 = (this->descriptor_set_out_name_)._M_string_length;
      }
      if ((sVar12 == 0 & this->source_info_in_descriptor_set_) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "--include_source_info only makes sense when combined with --descriptor_set_out."
                   ,0x4f);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        sVar12 = (this->descriptor_set_out_name_)._M_string_length;
      }
      PVar16 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if ((this->retain_options_in_descriptor_set_ == true) && (sVar12 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "--retain_options only makes sense when combined with --descriptor_set_out.",0x4a
                  );
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      goto LAB_0018bf9c;
    }
    break;
  case MODE_DECODE:
    if ((this->codec_type_)._M_string_length != 0) goto switchD_0018bd33_caseD_1;
    pbVar13 = (this->input_files_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = 0x38;
    pcVar18 = "When using --decode_raw, no input files should be given.";
    if ((pbVar13 !=
         (this->input_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->descriptor_set_in_names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0018bf84;
    pbVar14 = pbVar13;
    if ((this->dependency_out_name_)._M_string_length == 0) goto LAB_0018bf42;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x777);
    str._M_str = "Unexpected mode: ";
    str._M_len = 0x11;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_110,str);
    absl::lts_20250127::log_internal::LogMessage::
    operator<<<google::protobuf::compiler::CommandLineInterface::Mode,_0>
              ((LogMessage *)local_110,&this->mode_);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_110);
  }
  lVar15 = 0x38;
  pcVar18 = "Can only use --dependency_out=FILE when generating code.";
LAB_0018bf84:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,lVar15);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0018bf9c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return PVar16;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (size_t i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (const auto& kv : plugin_parameters_) {
    if (plugins_.find(kv.first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (const auto& d : output_directives_) {
      if (d.generator == nullptr) {
        // Infers the plugin name from the plugin_prefix_ and output directive.
        std::string plugin_name = PluginName(plugin_prefix_, d.name);

        // Since plugin_parameters_ is also inferred from --xxx_opt, we check
        // that it actually matches the plugin name inferred from --xxx_out.
        if (plugin_name == kv.first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }

    // This is a special case for cc_plugin invocations that are only with
    // "--cpp_opt" but no "--cpp_out". In this case, "--cpp_opt" only serves
    // as passing the arguments to cc_plugins, and no C++ generator is required
    // to be present in the invocation. We didn't have to skip for C++ generator
    // previously because the C++ generator was built-in.
    if (!foundImplicitPlugin &&
        kv.first != absl::StrCat(plugin_prefix_, "gen-cpp")) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" << kv.first.substr(plugin_prefix_.size() + 4) << "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      ABSL_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      ABSL_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty() && edition_defaults_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (retain_options_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--retain_options only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}